

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseModuleCommand(WastParser *this,Script *script,CommandPtr *out_command)

{
  undefined2 uVar1;
  ScriptModuleType SVar2;
  Command *pCVar3;
  WastParseOptions *pWVar4;
  _func_int **pp_Var5;
  undefined4 uVar6;
  ScriptModuleType SVar7;
  undefined4 uVar8;
  _Head_base<0UL,_wabt::ScriptModule_*,_false> _Var9;
  pointer pEVar10;
  Result RVar11;
  Result RVar12;
  Command *pCVar13;
  char *__function;
  Index IVar14;
  long lVar15;
  long *plVar16;
  Module *out_module;
  pointer pEVar17;
  pointer __p;
  Errors errors;
  _Head_base<0UL,_wabt::ScriptModule_*,_false> local_b8;
  ScriptModule *local_b0;
  CommandPtr *local_a8;
  Script *local_a0;
  Errors local_98;
  undefined1 local_78 [16];
  int local_68;
  int iStack_64;
  Stream *pSStack_60;
  long *local_58 [2];
  long local_48 [2];
  undefined1 local_38 [8];
  
  local_b8._M_head_impl = (ScriptModule *)0x0;
  RVar11 = ParseScriptModule(this,(unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                                   *)&local_b8);
  _Var9._M_head_impl = local_b8._M_head_impl;
  RVar12.enum_ = Error;
  if (RVar11.enum_ != Error) {
    SVar2 = (local_b8._M_head_impl)->type_;
    if (SVar2 == Quoted) {
      local_78._0_8_ = &local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"a binary module","");
      plVar16 = local_48;
      local_58[0] = plVar16;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"a text module","");
      local_98.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
                 (string *)local_78,local_38);
      RVar12 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_98,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_98);
      lVar15 = -0x40;
      do {
        if (plVar16 != (long *)plVar16[-2]) {
          operator_delete((long *)plVar16[-2],*plVar16 + 1);
        }
        plVar16 = plVar16 + -4;
        lVar15 = lVar15 + 0x20;
      } while (lVar15 != 0);
    }
    else {
      if (SVar2 == Binary) {
        local_a8 = out_command;
        local_a0 = script;
        pCVar13 = (Command *)operator_new(0x388);
        memset(pCVar13,0,0x370);
        pCVar13->type = ScriptModule;
        pCVar13->_vptr_Command = (_func_int **)&PTR__ScriptModuleCommand_0019b458;
        pCVar13[1]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[1].type = 0;
        *(undefined8 *)&pCVar13[1].field_0xc = 0;
        *(undefined8 *)((long)&pCVar13[2]._vptr_Command + 4) = 0;
        pCVar13[3]._vptr_Command = (_func_int **)(pCVar13 + 4);
        pCVar13[5]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[5].type = 0;
        pCVar13[6]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[6].type = 0;
        *(undefined8 *)&pCVar13[6].field_0xc = 0;
        *(undefined8 *)((long)&pCVar13[7]._vptr_Command + 4) = 0;
        memset(pCVar13 + 8,0,0x108);
        *(CommandType **)&pCVar13[0x18].type = &pCVar13[0x1b].type;
        pCVar13[0x19]._vptr_Command = (_func_int **)0x1;
        *(undefined8 *)&pCVar13[0x19].type = 0;
        pCVar13[0x1a]._vptr_Command = (_func_int **)0x0;
        pCVar13[0x1a].type = 0x3f800000;
        pCVar13[0x1b]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[0x1b].type = 0;
        pCVar13[0x1c]._vptr_Command = (_func_int **)(pCVar13 + 0x1f);
        *(undefined8 *)&pCVar13[0x1c].type = 1;
        pCVar13[0x1d]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[0x1d].type = 0;
        *(undefined4 *)&pCVar13[0x1e]._vptr_Command = 0x3f800000;
        *(undefined8 *)&pCVar13[0x1e].type = 0;
        pCVar13[0x1f]._vptr_Command = (_func_int **)0x0;
        *(CommandType **)&pCVar13[0x1f].type = &pCVar13[0x22].type;
        pCVar13[0x20]._vptr_Command = (_func_int **)0x1;
        *(undefined8 *)&pCVar13[0x20].type = 0;
        pCVar13[0x21]._vptr_Command = (_func_int **)0x0;
        pCVar13[0x21].type = 0x3f800000;
        pCVar13[0x22]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[0x22].type = 0;
        pCVar13[0x23]._vptr_Command = (_func_int **)(pCVar13 + 0x26);
        *(undefined8 *)&pCVar13[0x23].type = 1;
        pCVar13[0x24]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[0x24].type = 0;
        *(undefined4 *)&pCVar13[0x25]._vptr_Command = 0x3f800000;
        *(undefined8 *)&pCVar13[0x25].type = 0;
        pCVar13[0x26]._vptr_Command = (_func_int **)0x0;
        *(CommandType **)&pCVar13[0x26].type = &pCVar13[0x29].type;
        pCVar13[0x27]._vptr_Command = (_func_int **)0x1;
        *(undefined8 *)&pCVar13[0x27].type = 0;
        pCVar13[0x28]._vptr_Command = (_func_int **)0x0;
        pCVar13[0x28].type = 0x3f800000;
        pCVar13[0x29]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[0x29].type = 0;
        pCVar13[0x2a]._vptr_Command = (_func_int **)(pCVar13 + 0x2d);
        *(undefined8 *)&pCVar13[0x2a].type = 1;
        pCVar13[0x2b]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[0x2b].type = 0;
        *(undefined4 *)&pCVar13[0x2c]._vptr_Command = 0x3f800000;
        *(undefined8 *)&pCVar13[0x2c].type = 0;
        pCVar13[0x2d]._vptr_Command = (_func_int **)0x0;
        *(CommandType **)&pCVar13[0x2d].type = &pCVar13[0x30].type;
        pCVar13[0x2e]._vptr_Command = (_func_int **)0x1;
        *(undefined8 *)&pCVar13[0x2e].type = 0;
        pCVar13[0x2f]._vptr_Command = (_func_int **)0x0;
        pCVar13[0x2f].type = 0x3f800000;
        pCVar13[0x30]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[0x30].type = 0;
        pCVar13[0x31]._vptr_Command = (_func_int **)(pCVar13 + 0x34);
        *(undefined8 *)&pCVar13[0x31].type = 1;
        pCVar13[0x32]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[0x32].type = 0;
        *(undefined4 *)&pCVar13[0x33]._vptr_Command = 0x3f800000;
        *(undefined8 *)&pCVar13[0x33].type = 0;
        pCVar13[0x34]._vptr_Command = (_func_int **)0x0;
        *(CommandType **)&pCVar13[0x34].type = &pCVar13[0x37].type;
        pCVar13[0x35]._vptr_Command = (_func_int **)0x1;
        *(undefined8 *)&pCVar13[0x35].type = 0;
        pCVar13[0x36]._vptr_Command = (_func_int **)0x0;
        pCVar13[0x36].type = 0x3f800000;
        pCVar13[0x37]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[0x37].type = 0;
        pCVar13[0x38]._vptr_Command = (_func_int **)0x0;
        if ((_Var9._M_head_impl)->type_ != Binary) {
          __function = 
          "Derived *wabt::cast(Base *) [Derived = wabt::DataScriptModule<wabt::ScriptModuleType::Binary>, Base = wabt::ScriptModule]"
          ;
LAB_00136a39:
          __assert_fail("isa<Derived>(base)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/cast.h"
                        ,0x4e,__function);
        }
        out_module = (Module *)(pCVar13 + 1);
        pSStack_60 = (Stream *)0x0;
        local_58[0] = (long *)CONCAT44(local_58[0]._4_4_,0x10100);
        pWVar4 = this->options_;
        uVar1._0_1_ = (pWVar4->features).extended_const_enabled_;
        uVar1._1_1_ = (pWVar4->features).relaxed_simd_enabled_;
        local_68 = CONCAT22(local_68._2_2_,uVar1);
        local_78._0_8_ = *(undefined8 *)&pWVar4->features;
        local_78._8_8_ = *(undefined8 *)&(pWVar4->features).tail_call_enabled_;
        local_98.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_98.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        ReadBinaryIr("<text>",_Var9._M_head_impl[5]._vptr_ScriptModule,
                     *(long *)&_Var9._M_head_impl[5].type_ -
                     (long)_Var9._M_head_impl[5]._vptr_ScriptModule,(ReadBinaryOptions *)local_78,
                     &local_98,out_module);
        std::__cxx11::string::_M_assign((string *)(pCVar13 + 3));
        pEVar10 = local_98.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pp_Var5 = _Var9._M_head_impl[1]._vptr_ScriptModule;
        SVar7 = _Var9._M_head_impl[1].type_;
        uVar8 = *(undefined4 *)&_Var9._M_head_impl[1].field_0xc;
        SVar2 = _Var9._M_head_impl[2].type_;
        uVar6 = *(undefined4 *)&_Var9._M_head_impl[2].field_0xc;
        pCVar13[2]._vptr_Command = _Var9._M_head_impl[2]._vptr_ScriptModule;
        pCVar13[2].type = SVar2;
        *(undefined4 *)&pCVar13[2].field_0xc = uVar6;
        (out_module->loc).filename._M_len = (size_t)pp_Var5;
        pCVar13[1].type = SVar7;
        *(undefined4 *)&pCVar13[1].field_0xc = uVar8;
        local_b0 = _Var9._M_head_impl;
        for (pEVar17 = local_98.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>.
                       _M_impl.super__Vector_impl_data._M_start; pEVar17 != pEVar10;
            pEVar17 = pEVar17 + 1) {
          if (pEVar17->error_level != Error) {
            __assert_fail("error.error_level == ErrorLevel::Error",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                          ,0xd05,
                          "Result wabt::WastParser::ParseModuleCommand(Script *, CommandPtr *)");
          }
          if ((pEVar17->loc).field_1.field_1.offset == 0xffffffffffffffff) {
            Error(this,0x1725e4,(pEVar17->message)._M_dataplus._M_p);
          }
          else {
            Error(this,0x1725ff);
          }
        }
        local_b8._M_head_impl = (ScriptModule *)0x0;
        pp_Var5 = pCVar13[0x38]._vptr_Command;
        pCVar13[0x38]._vptr_Command = (_func_int **)local_b0;
        if (pp_Var5 != (_func_int **)0x0) {
          (**(code **)(*pp_Var5 + 8))();
        }
        script = local_a0;
        pCVar3 = (local_a8->_M_t).
                 super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
                 super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
                 super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
        (local_a8->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
        _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
        super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar13;
        if (pCVar3 != (Command *)0x0) {
          (*pCVar3->_vptr_Command[1])();
        }
        std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_98);
      }
      else if (SVar2 == Text) {
        pCVar13 = (Command *)operator_new(0x380);
        memset(pCVar13,0,0x370);
        pCVar13->_vptr_Command = (_func_int **)&PTR__ModuleCommand_001999b8;
        pCVar13[1]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[1].type = 0;
        *(undefined8 *)&pCVar13[1].field_0xc = 0;
        *(undefined8 *)((long)&pCVar13[2]._vptr_Command + 4) = 0;
        pCVar13[3]._vptr_Command = (_func_int **)(pCVar13 + 4);
        pCVar13[5]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[5].type = 0;
        pCVar13[6]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[6].type = 0;
        *(undefined8 *)&pCVar13[6].field_0xc = 0;
        *(undefined8 *)((long)&pCVar13[7]._vptr_Command + 4) = 0;
        memset(pCVar13 + 8,0,0x108);
        *(CommandType **)&pCVar13[0x18].type = &pCVar13[0x1b].type;
        pCVar13[0x19]._vptr_Command = (_func_int **)0x1;
        *(undefined8 *)&pCVar13[0x19].type = 0;
        pCVar13[0x1a]._vptr_Command = (_func_int **)0x0;
        pCVar13[0x1a].type = 0x3f800000;
        pCVar13[0x1b]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[0x1b].type = 0;
        pCVar13[0x1c]._vptr_Command = (_func_int **)(pCVar13 + 0x1f);
        *(undefined8 *)&pCVar13[0x1c].type = 1;
        pCVar13[0x1d]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[0x1d].type = 0;
        *(undefined4 *)&pCVar13[0x1e]._vptr_Command = 0x3f800000;
        *(undefined8 *)&pCVar13[0x1e].type = 0;
        pCVar13[0x1f]._vptr_Command = (_func_int **)0x0;
        *(CommandType **)&pCVar13[0x1f].type = &pCVar13[0x22].type;
        pCVar13[0x20]._vptr_Command = (_func_int **)0x1;
        *(undefined8 *)&pCVar13[0x20].type = 0;
        pCVar13[0x21]._vptr_Command = (_func_int **)0x0;
        pCVar13[0x21].type = 0x3f800000;
        pCVar13[0x22]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[0x22].type = 0;
        pCVar13[0x23]._vptr_Command = (_func_int **)(pCVar13 + 0x26);
        *(undefined8 *)&pCVar13[0x23].type = 1;
        pCVar13[0x24]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[0x24].type = 0;
        *(undefined4 *)&pCVar13[0x25]._vptr_Command = 0x3f800000;
        *(undefined8 *)&pCVar13[0x25].type = 0;
        pCVar13[0x26]._vptr_Command = (_func_int **)0x0;
        *(CommandType **)&pCVar13[0x26].type = &pCVar13[0x29].type;
        pCVar13[0x27]._vptr_Command = (_func_int **)0x1;
        *(undefined8 *)&pCVar13[0x27].type = 0;
        pCVar13[0x28]._vptr_Command = (_func_int **)0x0;
        pCVar13[0x28].type = 0x3f800000;
        pCVar13[0x29]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[0x29].type = 0;
        pCVar13[0x2a]._vptr_Command = (_func_int **)(pCVar13 + 0x2d);
        *(undefined8 *)&pCVar13[0x2a].type = 1;
        pCVar13[0x2b]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[0x2b].type = 0;
        *(undefined4 *)&pCVar13[0x2c]._vptr_Command = 0x3f800000;
        *(undefined8 *)&pCVar13[0x2c].type = 0;
        pCVar13[0x2d]._vptr_Command = (_func_int **)0x0;
        *(CommandType **)&pCVar13[0x2d].type = &pCVar13[0x30].type;
        pCVar13[0x2e]._vptr_Command = (_func_int **)0x1;
        *(undefined8 *)&pCVar13[0x2e].type = 0;
        pCVar13[0x2f]._vptr_Command = (_func_int **)0x0;
        pCVar13[0x2f].type = 0x3f800000;
        pCVar13[0x30]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[0x30].type = 0;
        pCVar13[0x31]._vptr_Command = (_func_int **)(pCVar13 + 0x34);
        *(undefined8 *)&pCVar13[0x31].type = 1;
        pCVar13[0x32]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[0x32].type = 0;
        *(undefined4 *)&pCVar13[0x33]._vptr_Command = 0x3f800000;
        *(undefined8 *)&pCVar13[0x33].type = 0;
        pCVar13[0x34]._vptr_Command = (_func_int **)0x0;
        *(CommandType **)&pCVar13[0x34].type = &pCVar13[0x37].type;
        pCVar13[0x35]._vptr_Command = (_func_int **)0x1;
        *(undefined8 *)&pCVar13[0x35].type = 0;
        pCVar13[0x36]._vptr_Command = (_func_int **)0x0;
        pCVar13[0x36].type = 0x3f800000;
        pCVar13[0x37]._vptr_Command = (_func_int **)0x0;
        *(undefined8 *)&pCVar13[0x37].type = 0;
        if ((_Var9._M_head_impl)->type_ != Text) {
          __function = 
          "Derived *wabt::cast(Base *) [Derived = wabt::TextScriptModule, Base = wabt::ScriptModule]"
          ;
          goto LAB_00136a39;
        }
        out_module = (Module *)(pCVar13 + 1);
        Module::operator=(out_module,(Module *)(_Var9._M_head_impl + 1));
        pCVar3 = (out_command->_M_t).
                 super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
                 super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
                 super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
        (out_command->_M_t).
        super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
        super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
        super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar13;
        if (pCVar3 != (Command *)0x0) {
          (*pCVar3->_vptr_Command[1])();
        }
      }
      else {
        out_module = (Module *)0x0;
      }
      RVar12.enum_ = Ok;
      if (script != (Script *)0x0) {
        IVar14 = (Index)((ulong)((long)(script->commands).
                                       super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(script->commands).
                                      super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3);
        if ((out_module->name)._M_string_length != 0) {
          local_78._0_8_ = (out_module->loc).filename._M_len;
          local_78._8_8_ = (out_module->loc).filename._M_str;
          local_68 = (out_module->loc).field_1.field_0.line;
          iStack_64 = (out_module->loc).field_1.field_0.first_column;
          pSStack_60 = *(Stream **)((long)&(out_module->loc).field_1 + 8);
          local_58[0] = (long *)CONCAT44(local_58[0]._4_4_,IVar14);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
          ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                      *)&script->module_bindings,0,&out_module->name);
        }
        this->last_module_index_ = IVar14;
        RVar12.enum_ = Ok;
      }
    }
  }
  if (local_b8._M_head_impl != (ScriptModule *)0x0) {
    (*(local_b8._M_head_impl)->_vptr_ScriptModule[1])();
  }
  return (Result)RVar12.enum_;
}

Assistant:

Result WastParser::ParseModuleCommand(Script* script, CommandPtr* out_command) {
  WABT_TRACE(ParseModuleCommand);
  std::unique_ptr<ScriptModule> script_module;
  CHECK_RESULT(ParseScriptModule(&script_module));

  Module* module = nullptr;

  switch (script_module->type()) {
    case ScriptModuleType::Text: {
      auto command = std::make_unique<ModuleCommand>();
      module = &command->module;
      *module = std::move(cast<TextScriptModule>(script_module.get())->module);
      *out_command = std::move(command);
      break;
    }

    case ScriptModuleType::Binary: {
      auto command = std::make_unique<ScriptModuleCommand>();
      module = &command->module;
      auto* bsm = cast<BinaryScriptModule>(script_module.get());
      ReadBinaryOptions options;
#if WABT_TRACING
      auto log_stream = FileStream::CreateStdout();
      options.log_stream = log_stream.get();
#endif
      options.features = options_->features;
      Errors errors;
      const char* filename = "<text>";
      ReadBinaryIr(filename, bsm->data.data(), bsm->data.size(), options,
                   &errors, module);
      module->name = bsm->name;
      module->loc = bsm->loc;
      for (const auto& error : errors) {
        assert(error.error_level == ErrorLevel::Error);
        if (error.loc.offset == kInvalidOffset) {
          Error(bsm->loc, "error in binary module: %s", error.message.c_str());
        } else {
          Error(bsm->loc, "error in binary module: @0x%08" PRIzx ": %s",
                error.loc.offset, error.message.c_str());
        }
      }

      command->script_module = std::move(script_module);
      *out_command = std::move(command);
      break;
    }

    case ScriptModuleType::Quoted:
      return ErrorExpected({"a binary module", "a text module"});
  }

  // script is nullptr when ParseModuleCommand is called from ParseModule.
  if (script) {
    Index command_index = script->commands.size();

    if (!module->name.empty()) {
      script->module_bindings.emplace(module->name,
                                      Binding(module->loc, command_index));
    }

    last_module_index_ = command_index;
  }

  return Result::Ok;
}